

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_strrchar(char *str,char ch)

{
  char *pcVar1;
  char *p;
  char *found;
  char *pcStack_18;
  char ch_local;
  char *str_local;
  
  p = (char *)0x0;
  pcStack_18 = str;
  if (ch == '\0') {
    str_local = sx_strchar(str,'\0');
  }
  else {
    while (pcVar1 = sx_strchar(pcStack_18,ch), pcVar1 != (char *)0x0) {
      pcStack_18 = pcVar1 + 1;
      p = pcVar1;
    }
    str_local = p;
  }
  return str_local;
}

Assistant:

const char* sx_strrchar(const char* str, char ch)
{
    const char *found = NULL, *p;
    ch = (uint8_t)ch;

    if (ch == '\0')
        return sx_strchar(str, '\0');
    while ((p = sx_strchar(str, ch)) != NULL) {
        found = p;
        str = p + 1;
    }
    return (const char*)found;
}